

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

int bus0_pipe_start(void *arg)

{
  nni_list *list;
  uint16_t uVar1;
  bus0_sock *s;
  bus0_pipe *p;
  void *arg_local;
  
  list = *(nni_list **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x70) {
    nni_mtx_lock((nni_mtx *)(list + 1));
    nni_list_append(list,arg);
    nni_mtx_unlock((nni_mtx *)(list + 1));
    bus0_pipe_recv((bus0_pipe *)arg);
    arg_local._4_4_ = 0;
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer pipe protocol %d is not BUS protocol, rejected.",
                 (ulong)uVar1);
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
bus0_pipe_start(void *arg)
{
	bus0_pipe *p = arg;
	bus0_sock *s = p->bus;

	if (nni_pipe_peer(p->pipe) != NNI_PROTO_BUS_V0) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer pipe protocol %d is not BUS protocol, rejected.",
		    nni_pipe_peer(p->pipe));
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	nni_list_append(&s->pipes, p);
	nni_mtx_unlock(&s->mtx);

	bus0_pipe_recv(p);

	return (0);
}